

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vector3<double> * phyr::cross<double>(Normal3<double> *n,Vector3<double> *v)

{
  double *in_RDX;
  double *in_RSI;
  Vector3<double> *in_RDI;
  double z2;
  double y2;
  double x2;
  double z1;
  double y1;
  double x1;
  
  Vector3<double>::Vector3
            (in_RDI,in_RSI[1] * in_RDX[2] + -(in_RSI[2] * in_RDX[1]),
             in_RSI[2] * *in_RDX + -(*in_RSI * in_RDX[2]),
             *in_RSI * in_RDX[1] + -(in_RSI[1] * *in_RDX));
  return in_RDI;
}

Assistant:

inline Vector3<T> cross(const Normal3<T>& n, const Vector3<T>& v) {
    ASSERT(!n.hasNaNs() && !v.hasNaNs());
    double x1 = n.x, y1 = n.y, z1 = n.z;
    double x2 = v.x, y2 = v.y, z2 = v.z;
    return Vector3<T>((y1 * z2 - z1 * y2), (z1 * x2 - x1 * z2), (x1 * y2 - y1 * x2));
}